

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Path * __thiscall kj::PathPtr::append(Path *__return_storage_ptr__,PathPtr *this,Path *suffix)

{
  size_t sVar1;
  size_t sVar2;
  String *params;
  Array<kj::String> local_c0;
  String *local_a8;
  String *p_1;
  String *__end1_1;
  String *__begin1_1;
  Array<kj::String> *__range1_1;
  String *local_70;
  String *p;
  String *__end1;
  String *local_50;
  String *__begin1;
  ArrayPtr<const_kj::String> *__range1;
  ArrayBuilder<kj::String> newParts;
  Path *suffix_local;
  PathPtr *this_local;
  
  newParts.disposer = (ArrayDisposer *)suffix;
  sVar1 = ArrayPtr<const_kj::String>::size(&this->parts);
  sVar2 = Array<kj::String>::size((Array<kj::String> *)newParts.disposer);
  heapArrayBuilder<kj::String>((ArrayBuilder<kj::String> *)&__range1,sVar1 + sVar2);
  __begin1 = (String *)this;
  local_50 = ArrayPtr<const_kj::String>::begin(&this->parts);
  p = ArrayPtr<const_kj::String>::end((ArrayPtr<const_kj::String> *)__begin1);
  for (; local_50 != p; local_50 = local_50 + 1) {
    local_70 = local_50;
    heapString((String *)&__range1_1,local_50);
    ArrayBuilder<kj::String>::add<kj::String>
              ((ArrayBuilder<kj::String> *)&__range1,(String *)&__range1_1);
    String::~String((String *)&__range1_1);
  }
  __begin1_1 = (String *)newParts.disposer;
  __end1_1 = Array<kj::String>::begin((Array<kj::String> *)newParts.disposer);
  p_1 = Array<kj::String>::end((Array<kj::String> *)__begin1_1);
  for (; __end1_1 != p_1; __end1_1 = __end1_1 + 1) {
    local_a8 = __end1_1;
    params = mv<kj::String>(__end1_1);
    ArrayBuilder<kj::String>::add<kj::String>((ArrayBuilder<kj::String> *)&__range1,params);
  }
  ArrayBuilder<kj::String>::finish(&local_c0,(ArrayBuilder<kj::String> *)&__range1);
  Path::Path(__return_storage_ptr__,&local_c0,ALREADY_CHECKED);
  Array<kj::String>::~Array(&local_c0);
  ArrayBuilder<kj::String>::~ArrayBuilder((ArrayBuilder<kj::String> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

Path PathPtr::append(Path&& suffix) const {
  auto newParts = kj::heapArrayBuilder<String>(parts.size() + suffix.parts.size());
  for (auto& p: parts) newParts.add(heapString(p));
  for (auto& p: suffix.parts) newParts.add(kj::mv(p));
  return Path(newParts.finish(), Path::ALREADY_CHECKED);
}